

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int wally_descriptor_to_addresses
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t start_child_num,uint32_t end_child_num,uint32_t network,uint32_t flags,
              wally_descriptor_addresses *addresses)

{
  uint uVar1;
  wally_descriptor_script_item *script_item;
  size_t sVar2;
  uint32_t *local_a8;
  wally_descriptor_script_item *script_items;
  wally_descriptor_address_item *address_items;
  address_script_t *addr_item;
  size_t addr_tbl_max;
  size_t index;
  uint local_48;
  uint32_t num_items;
  uint32_t child_num;
  int ret;
  uint32_t end_child_num_local;
  uint32_t start_child_num_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *descriptor_local;
  
  address_items = (wally_descriptor_address_item *)0x0;
  if (((addresses == (wally_descriptor_addresses *)0x0) || (descriptor == (char *)0x0)) ||
     (end_child_num < start_child_num)) {
    descriptor_local._4_4_ = 0xfffffffe;
  }
  else {
    if (network == 0xff) {
      address_items = (wally_descriptor_address_item *)(g_network_address_table + 2);
    }
    else {
      for (addr_tbl_max = 0; addr_tbl_max < 5; addr_tbl_max = addr_tbl_max + 1) {
        if (network == g_network_address_table[addr_tbl_max].network) {
          address_items = (wally_descriptor_address_item *)(g_network_address_table + addr_tbl_max);
          break;
        }
      }
    }
    if (address_items == (wally_descriptor_address_item *)0x0) {
      descriptor_local._4_4_ = 0xfffffffe;
    }
    else {
      uVar1 = (end_child_num - start_child_num) + 1;
      script_items = (wally_descriptor_script_item *)wally_malloc((ulong)uVar1 * 0x18);
      if ((wally_descriptor_address_item *)script_items == (wally_descriptor_address_item *)0x0) {
        descriptor_local._4_4_ = 0xfffffffd;
      }
      else {
        script_item = (wally_descriptor_script_item *)wally_malloc((ulong)uVar1 * 0x18);
        if (script_item == (wally_descriptor_script_item *)0x0) {
          wally_free(script_items);
          descriptor_local._4_4_ = 0xfffffffd;
        }
        else {
          wally_bzero(script_items,(ulong)uVar1 * 0x18);
          wally_bzero(script_item,(ulong)uVar1 * 0x18);
          addr_tbl_max = 0;
          for (local_48 = start_child_num; local_48 <= end_child_num; local_48 = local_48 + 1) {
            script_item[addr_tbl_max].child_num = local_48;
            ((wally_descriptor_address_item *)script_items)[addr_tbl_max].child_num = local_48;
            addr_tbl_max = addr_tbl_max + 1;
          }
          if (address_items == (wally_descriptor_address_item *)0x0) {
            local_a8 = (uint32_t *)0x0;
          }
          else {
            local_a8 = &network;
          }
          num_items = parse_miniscript(descriptor,key_name_array,key_value_array,array_len,flags,3,
                                       local_a8,0,0,script_item,(ulong)uVar1,(uint32_t *)0x0,
                                       (char **)0x0);
          if (num_items == 0) {
            addr_tbl_max = 0;
            while ((addr_tbl_max < uVar1 &&
                   (num_items = descriptor_scriptpubkey_to_address
                                          ((address_script_t *)address_items,
                                           script_item[addr_tbl_max].script,
                                           script_item[addr_tbl_max].script_len,
                                           &((wally_descriptor_address_item *)script_items)
                                            [addr_tbl_max].address), num_items == 0))) {
              sVar2 = strlen(((wally_descriptor_address_item *)script_items)[addr_tbl_max].address);
              ((wally_descriptor_address_item *)script_items)[addr_tbl_max].address_len = sVar2;
              addr_tbl_max = addr_tbl_max + 1;
            }
          }
          if (num_items == 0) {
            addresses->items = (wally_descriptor_address_item *)script_items;
            addresses->num_items = (ulong)uVar1;
            script_items = (wally_descriptor_script_item *)0x0;
          }
          if (script_item != (wally_descriptor_script_item *)0x0) {
            for (addr_tbl_max = 0; addr_tbl_max < uVar1; addr_tbl_max = addr_tbl_max + 1) {
              if (script_item[addr_tbl_max].script != (uchar *)0x0) {
                wally_bzero(script_item[addr_tbl_max].script,script_item[addr_tbl_max].script_len);
                wally_free(script_item[addr_tbl_max].script);
              }
            }
            wally_bzero(script_item,(ulong)uVar1 * 0x18);
            wally_free(script_item);
          }
          if (script_items != (wally_descriptor_script_item *)0x0) {
            free_descriptor_address_item((wally_descriptor_address_item *)script_items,(ulong)uVar1)
            ;
          }
          descriptor_local._4_4_ = num_items;
        }
      }
    }
  }
  return descriptor_local._4_4_;
}

Assistant:

int wally_descriptor_to_addresses(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t start_child_num,
    uint32_t end_child_num,
    uint32_t network,
    uint32_t flags,
    struct wally_descriptor_addresses *addresses)
{
    int ret;
    uint32_t child_num;
    uint32_t num_items;
    size_t index;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;
    struct wally_descriptor_address_item *address_items = NULL;
    struct wally_descriptor_script_item *script_items = NULL;

    if (!addresses || !descriptor || (start_child_num > end_child_num))
        return WALLY_EINVAL;

    if (network == WALLY_NETWORK_BITCOIN_REGTEST)
        addr_item = &g_network_address_table[2];
    else
        for (index = 0; index < addr_tbl_max; ++index) {
            if (network == (uint32_t)g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }

    if (!addr_item)
        return WALLY_EINVAL;

    num_items = end_child_num - start_child_num + 1;

    address_items = (struct wally_descriptor_address_item *) wally_malloc(sizeof(struct wally_descriptor_address_item) * num_items);
    if (!address_items)
        return WALLY_ENOMEM;

    script_items = (struct wally_descriptor_script_item *) wally_malloc(sizeof(struct wally_descriptor_script_item) * num_items);
    if (!script_items) {
        wally_free((void *)address_items);
        return WALLY_ENOMEM;
    }
    wally_bzero(address_items, sizeof(struct wally_descriptor_address_item) * num_items);
    wally_bzero(script_items, sizeof(struct wally_descriptor_script_item) * num_items);

    index = 0;
    for (child_num = start_child_num; child_num <= end_child_num; ++child_num) {
        script_items[index].child_num = child_num;
        address_items[index].child_num = child_num;
        ++index;
    }

    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        (!addr_item) ? NULL : &network,
        0,
        0,
        script_items,
        num_items,
        NULL,
        NULL);
    if (ret == WALLY_OK) {
        for (index = 0; index < num_items; ++index) {
            ret = descriptor_scriptpubkey_to_address(addr_item,
                                                     script_items[index].script,
                                                     script_items[index].script_len,
                                                     &address_items[index].address);
            if (ret != WALLY_OK)
                break;
            address_items[index].address_len = strlen(address_items[index].address);
        }
    }

    if (ret == WALLY_OK) {
        addresses->items = address_items;
        addresses->num_items = num_items;
        address_items = NULL;
    }

    if (script_items) {
        for (index = 0; index < num_items; ++index) {
            if (script_items[index].script) {
                wally_bzero((char *)script_items[index].script, script_items[index].script_len);
                wally_free(script_items[index].script);
            }
        }
        wally_bzero((char *)script_items, sizeof(struct wally_descriptor_script_item) * num_items);
        wally_free((void *)script_items);
    }
    if (address_items)
        free_descriptor_address_item(address_items, num_items);
    return ret;
}